

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop_measures.cc
# Opt level: O3

S1Angle S2::GetPerimeter(S2PointLoopSpan loop)

{
  reference x;
  reference y;
  ulong uVar1;
  ulong in_RSI;
  S1Angle SVar2;
  S1Angle local_38;
  S2PointLoopSpan local_30;
  
  SVar2.radians_ = 0.0;
  if (1 < in_RSI) {
    uVar1 = 0;
    local_30.super_S2PointSpan.len_ = in_RSI;
    do {
      x = S2PointLoopSpan::operator[](&local_30,(int)uVar1);
      uVar1 = uVar1 + 1;
      y = S2PointLoopSpan::operator[](&local_30,(int)uVar1);
      S1Angle::S1Angle(&local_38,x,y);
      SVar2.radians_ = SVar2.radians_ + local_38.radians_;
    } while (uVar1 < local_30.super_S2PointSpan.len_);
  }
  return (S1Angle)SVar2.radians_;
}

Assistant:

S1Angle GetPerimeter(S2PointLoopSpan loop) {
  S1Angle perimeter = S1Angle::Zero();
  if (loop.size() <= 1) return perimeter;
  for (int i = 0; i < loop.size(); ++i) {
    perimeter += S1Angle(loop[i], loop[i + 1]);
  }
  return perimeter;
}